

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ElementCount EVar5;
  ushort uVar6;
  uint i;
  ElementCount index;
  ushort uVar7;
  int iVar8;
  int iVar9;
  ListReader *this_00;
  Reader fields;
  Fault f_1;
  Reader replacementFields;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x80) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x80) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x80) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
    }
    if (uVar2 < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0xd0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0xd0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0xd0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
    }
    if (uVar2 < 0xd0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x100) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x100) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
    }
    if (uVar2 < 0x100) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((((0xff < uVar1) &&
       (pvVar3 = (replacement->_reader).data, *(short *)((long)pvVar3 + 0x1e) != 0)) &&
      (uVar2 = (structNode->_reader).dataSize, 0xff < uVar2)) &&
     (pvVar4 = (structNode->_reader).data, *(short *)((long)pvVar4 + 0x1e) != 0)) {
    iVar8 = 0;
    iVar9 = 0;
    if (0x11f < uVar1) {
      iVar9 = *(int *)((long)pvVar3 + 0x20);
    }
    if (0x11f < uVar2) {
      iVar8 = *(int *)((long)pvVar4 + 0x20);
    }
    if (iVar9 != iVar8) {
      this_00 = &local_f0;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x2f6,FAILED,
                 "replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset()",
                 "\"union discriminant position changed\"",
                 (char (*) [36])"union discriminant position changed");
      goto LAB_001755d9;
    }
  }
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&local_f0,structNode);
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&local_90,replacement);
  EVar5 = local_f0.elementCount;
  if (local_90.elementCount < local_f0.elementCount) {
    EVar5 = local_90.elementCount;
  }
  if (local_f0.elementCount < local_90.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_90.elementCount < local_f0.elementCount) {
    replacementIsOlder(this);
  }
  for (index = 0; EVar5 != index; index = index + 1) {
    _::ListReader::getStructElement((StructReader *)&local_c0,&local_f0,index);
    _::ListReader::getStructElement(&local_60,&local_90,index);
    checkCompatibility(this,(Reader *)&local_c0,(Reader *)&local_60);
  }
  if (((structNode->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) == 0)) {
    if ((replacement->_reader).dataSize < 0xe1) {
      return;
    }
    if ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0) {
      return;
    }
    replacementIsNewer(this);
    return;
  }
  if (((replacement->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0)) {
    replacementIsOlder(this);
    return;
  }
  if (replacementScopeId == scopeId) {
    return;
  }
  this_00 = &local_c0;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
            ((Fault *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x311,FAILED,"replacementScopeId == scopeId","\"group node\'s scope changed\"",
             (char (*) [27])"group node\'s scope changed");
LAB_001755d9:
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = std::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }